

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  initializer_list<int> __l;
  LockProxy guard;
  allocator_type local_b9;
  CategoriesMutex local_b8;
  condition_variable local_40 [48];
  
  local_b8.current_category_ = 1;
  local_b8.count_ = 3;
  local_b8.category_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 5;
  __l._M_len = 3;
  __l._M_array = &local_b8.current_category_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             ((long)&local_b8.category_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data + 8),__l,&local_b9);
  local_b8.internal_.super___mutex_base._M_mutex._16_8_ = 0xffffffff;
  local_b8.internal_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)
       local_b8.category_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8.internal_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)
       local_b8.category_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b8._72_8_ = local_b8.internal_.super___mutex_base._M_mutex.__align;
  local_b8.category_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.category_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.internal_.super___mutex_base._M_mutex.__align = 0;
  local_b8._80_8_ = 0;
  local_b8._88_8_ = 0;
  local_b8._96_8_ = 0;
  local_b8._104_8_ = 0;
  local_b8._112_8_ = 0;
  std::condition_variable::condition_variable(local_40);
  if (local_b8.category_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_b8.category_sizes_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish,
                    local_b8.internal_.super___mutex_base._M_mutex.__align -
                    (long)local_b8.category_sizes_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
  }
  CategoriesMutex::try_lock(&local_b8,(int)&local_b8 + 0x30);
  CategoriesMutex::LockProxy::~LockProxy((LockProxy *)&local_b8);
  std::condition_variable::~condition_variable(local_40);
  if (local_b8.internal_.super___mutex_base._M_mutex.__data.__list.__prev !=
      (__pthread_internal_list *)0x0) {
    operator_delete(local_b8.internal_.super___mutex_base._M_mutex.__data.__list.__prev,
                    local_b8._72_8_ - local_b8.internal_.super___mutex_base._M_mutex._24_8_);
  }
  return 0;
}

Assistant:

int main() {
    CategoriesMutex mutex({1, 3, 5});
    if (auto guard = mutex.try_lock(1); guard) {
        // critical section
    }
}